

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

void __thiscall
Printer_printComponentWithMultipleFullyQualifiedMathDocuments_Test::TestBody
          (Printer_printComponentWithMultipleFullyQualifiedMathDocuments_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  char *pcVar4;
  AssertHelper local_170 [8];
  Message local_168 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  undefined1 local_140 [8];
  AssertionResult gtest_ar;
  string local_128 [32];
  undefined1 local_108 [8];
  string e;
  shared_ptr<libcellml::Component> local_d8;
  undefined1 local_c8 [8];
  ModelPtr model;
  ParserPtr parser;
  PrinterPtr printer;
  string local_90 [8];
  string math2;
  string local_68 [8];
  string math1;
  allocator<char> local_31;
  string local_30 [8];
  string in;
  Printer_printComponentWithMultipleFullyQualifiedMathDocuments_Test *this_local;
  
  in.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,
             "<?xml version=\'1.0\'?>\n<model name=\"multiple_math_in_component\"\n    xmlns=\"http://www.cellml.org/cellml/2.0#\"\n    xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\">\n    <component name=\"environment\">\n        <variable name=\"nK_stim\" units=\"dimensionless\"/>\n        <variable name=\"stimPeriod\" units=\"second\"/>\n    </component>\n</model>\n"
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_68,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<math\n    xmlns=\"http://www.w3.org/1998/Math/MathML\"\n    xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\">\n    <apply>\n        <eq/>\n        <ci>nK_stim</ci>\n        <cn cellml:units=\"dimensionless\">0.3</cn>\n    </apply>\n</math>\n"
             ,(allocator<char> *)(math2.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(math2.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_90,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<math\n    xmlns=\"http://www.w3.org/1998/Math/MathML\"\n    xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\">\n    <apply>\n        <eq/>\n        <ci>stimPeriod</ci>\n        <cn cellml:units=\"second\">42.6</cn>\n    </apply>\n</math>\n"
             ,(allocator<char> *)
              ((long)&printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Printer::create();
  this_00 = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  libcellml::Parser::parseModel((string *)local_c8);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_c8);
  libcellml::ComponentEntity::component((ulong)&local_d8);
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_d8);
  libcellml::Component::appendMath((string *)peVar2);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_d8);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_c8);
  libcellml::ComponentEntity::component((ulong)((long)&e.field_2 + 8));
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(e.field_2._M_local_buf + 8));
  libcellml::Component::appendMath((string *)peVar2);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)((long)&e.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_128,"printer/component_with_multiple_math.cellml",
             (allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  fileContents((string *)local_108);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::Printer::printModel_abi_cxx11_((shared_ptr *)&local_160,SUB81(peVar3,0));
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_140,"e","printer->printModel(model)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
             &local_160);
  std::__cxx11::string::~string((string *)&local_160);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(local_168);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              (local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/printer/printer.cpp"
               ,0x40f,pcVar4);
    testing::internal::AssertHelper::operator=(local_170,local_168);
    testing::internal::AssertHelper::~AssertHelper(local_170);
    testing::Message::~Message(local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  std::__cxx11::string::~string((string *)local_108);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_c8);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Printer>::~shared_ptr
            ((shared_ptr<libcellml::Printer> *)
             &parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(Printer, printComponentWithMultipleFullyQualifiedMathDocuments)
{
    const std::string in =
        "<?xml version='1.0'?>\n"
        "<model name=\"multiple_math_in_component\"\n"
        "    xmlns=\"http://www.cellml.org/cellml/2.0#\"\n"
        "    xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\">\n"
        "    <component name=\"environment\">\n"
        "        <variable name=\"nK_stim\" units=\"dimensionless\"/>\n"
        "        <variable name=\"stimPeriod\" units=\"second\"/>\n"
        "    </component>\n"
        "</model>\n";

    const std::string math1 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<math\n"
        "    xmlns=\"http://www.w3.org/1998/Math/MathML\"\n"
        "    xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\">\n"
        "    <apply>\n"
        "        <eq/>\n"
        "        <ci>nK_stim</ci>\n"
        "        <cn cellml:units=\"dimensionless\">0.3</cn>\n"
        "    </apply>\n"
        "</math>\n";

    const std::string math2 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<math\n"
        "    xmlns=\"http://www.w3.org/1998/Math/MathML\"\n"
        "    xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\">\n"
        "    <apply>\n"
        "        <eq/>\n"
        "        <ci>stimPeriod</ci>\n"
        "        <cn cellml:units=\"second\">42.6</cn>\n"
        "    </apply>\n"
        "</math>\n";

    auto printer = libcellml::Printer::create();
    auto parser = libcellml::Parser::create();

    auto model = parser->parseModel(in);

    model->component(0)->appendMath(math1);
    model->component(0)->appendMath(math2);

    const std::string e = fileContents("printer/component_with_multiple_math.cellml");
    EXPECT_EQ(e, printer->printModel(model));
}